

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

iterator * __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::erase(iterator *__return_storage_ptr__,
       dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       *this,const_iterator f,const_iterator l)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  
  do {
    if (f.pos == l.pos) {
      (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
      consider_shrink_ = true;
      __return_storage_ptr__->ht = this;
      __return_storage_ptr__->pos = f.pos;
      __return_storage_ptr__->end = f.end;
      return __return_storage_ptr__;
    }
    sVar4 = this->num_deleted;
    if (sVar4 == 0) {
      (f.pos)->first = (this->key_info).delkey;
      (f.pos)->second = 0;
LAB_0090302a:
      this->num_deleted = sVar4 + 1;
    }
    else {
      iVar2 = (this->key_info).delkey;
      iVar3 = (f.pos)->first;
      piVar1 = &(this->key_info).super_TransparentHasher.super_Hasher.num_compares_;
      *piVar1 = *piVar1 + 1;
      (f.pos)->first = iVar2;
      (f.pos)->second = 0;
      if (iVar2 != iVar3) goto LAB_0090302a;
    }
    f.pos = f.pos + 1;
    dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_empty_and_deleted(&f);
  } while( true );
}

Assistant:

iterator erase(const_iterator f, const_iterator l) {
    for (; f != l; ++f) {
      if (set_deleted(f))  // should always be true
        ++num_deleted;
    }
    settings.set_consider_shrink(
        true);  // will think about shrink after next insert
    return iterator(this, const_cast<pointer>(f.pos), const_cast<pointer>(f.end), false);
  }